

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  byte *pbVar5;
  ValueHolder VVar6;
  CommentInfo *pCVar7;
  ptrdiff_t pVar8;
  ptrdiff_t pVar9;
  ptrdiff_t pVar10;
  bool bVar11;
  ulong value;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  Value *this_00;
  Value local_90;
  Value local_68;
  Value local_40;
  
  pbVar5 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar12 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar14 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar14 < pbVar5) {
    uVar13 = uVar12 / 10;
    value = 0;
    do {
      bVar2 = *pbVar14;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_0011f52c:
        bVar11 = decodeDouble(this,token,decoded);
        return bVar11;
      }
      pbVar14 = pbVar14 + 1;
      uVar15 = (ulong)(bVar2 - 0x30);
      if ((uVar13 <= value) && (((uVar13 < value || (pbVar14 != pbVar5)) || (uVar12 % 10 < uVar15)))
         ) goto LAB_0011f52c;
      value = uVar15 + value * 10;
    } while (pbVar14 < pbVar5);
    if (cVar1 != '-') {
      if (0x7fffffff < value) {
        this_00 = &local_90;
        Value::Value(this_00,value);
        goto LAB_0011f54f;
      }
      goto LAB_0011f53f;
    }
LAB_0011f522:
    value = -value;
    this_00 = &local_40;
  }
  else {
    value = 0;
    if (cVar1 == '-') goto LAB_0011f522;
LAB_0011f53f:
    this_00 = &local_68;
  }
  Value::Value(this_00,value);
LAB_0011f54f:
  uVar3 = *(ushort *)&decoded->field_0x8;
  uVar4 = *(ushort *)&this_00->field_0x8;
  VVar6 = decoded->value_;
  decoded->value_ = this_00->value_;
  this_00->value_ = VVar6;
  *(ushort *)&decoded->field_0x8 = uVar4 & 0x1ff | uVar3 & 0xfe00;
  *(ushort *)&this_00->field_0x8 = uVar3 & 0x1ff | uVar4 & 0xfe00;
  pCVar7 = decoded->comments_;
  decoded->comments_ = this_00->comments_;
  this_00->comments_ = pCVar7;
  pVar8 = this_00->limit_;
  pVar9 = decoded->start_;
  pVar10 = decoded->limit_;
  decoded->start_ = this_00->start_;
  decoded->limit_ = pVar8;
  this_00->start_ = pVar9;
  this_00->limit_ = pVar10;
  Value::~Value(this_00);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}